

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::GeneratorConst::to_string_abi_cxx11_(string *__return_storage_ptr__,GeneratorConst *this)

{
  GeneratorConst *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->gen_->name);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorConst::to_string() const { return gen_.name; }